

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O3

void __thiscall
chrono::utils::ChISO2631_1_AVTransition::Config
          (ChISO2631_1_AVTransition *this,double step,double f4,double Q4)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar5._8_56_ = in_register_00001288;
  auVar5._0_8_ = Q4;
  dVar1 = f4 * 6.283185307179586;
  this->m_Ts = step;
  this->m_wc3 = 0.0;
  auVar4 = auVar5._0_16_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = Q4 + Q4;
  auVar6 = vunpcklpd_avx(auVar4,auVar6);
  this->m_wc4 = dVar1;
  this->m_Q4 = Q4;
  auVar2._0_8_ = dVar1 * step * auVar6._0_8_ * step;
  auVar2._8_8_ = dVar1 * step * auVar6._8_8_ * step;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (step + step) * dVar1;
  auVar6 = vfmadd231sd_fma(auVar7,auVar2,auVar3);
  auVar7 = vfmadd231sd_fma(auVar6,auVar4,ZEXT816(0x4010000000000000));
  auVar10._8_8_ = 0;
  auVar10._0_8_ = step * -2.0 * dVar1;
  auVar3 = vfmadd231sd_fma(auVar10,auVar2,auVar3);
  auVar11._0_8_ = dVar1 * auVar2._0_8_;
  auVar11._8_8_ = dVar1 * auVar2._8_8_;
  auVar6 = vshufpd_avx(auVar2,auVar4,1);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = Q4 * -8.0;
  auVar3 = vunpcklpd_avx(auVar9,auVar3);
  auVar4._8_8_ = 0x4010000000000000;
  auVar4._0_8_ = dVar1;
  auVar3 = vfmadd213pd_fma(auVar4,auVar6,auVar3);
  auVar8._0_8_ = auVar7._0_8_;
  auVar8._8_8_ = auVar8._0_8_;
  auVar6 = vdivpd_avx(auVar11,auVar8);
  auVar3 = vdivpd_avx(auVar3,auVar8);
  this->m_b0 = (double)auVar6._0_8_;
  this->m_b1 = (double)auVar6._8_8_;
  dVar1 = (double)vmovlpd_avx(auVar6);
  this->m_b2 = dVar1;
  this->m_a1 = (double)auVar3._0_8_;
  this->m_a2 = (double)auVar3._8_8_;
  this->m_a0 = 1.0;
  this->m_u_hist1 = 0.0;
  this->m_u_hist2 = 0.0;
  this->m_y_hist1 = 0.0;
  this->m_y_hist2 = 0.0;
  return;
}

Assistant:

void ChISO2631_1_AVTransition::Config(double step, double f4, double Q4) {
    // Standard Bilinear Transform
    m_Ts = step;
    m_wc3 = 0.0;
    m_wc4 = CH_C_2PI * f4;
    m_Q4 = Q4;

    m_b0 = m_Q4 * m_Ts * m_Ts * m_wc4 * m_wc4;
    m_b1 = 2.0 * m_Q4 * m_Ts * m_Ts * m_wc4 * m_wc4;
    m_b2 = m_Q4 * m_Ts * m_Ts * m_wc4 * m_wc4;

    m_a0 = m_Q4 * m_Ts * m_Ts * m_wc4 * m_wc4 + 2.0 * m_Ts * m_wc4 + 4.0 * m_Q4;
    m_a1 = 2.0 * m_Q4 * m_Ts * m_Ts * m_wc4 * m_wc4 - 8.0 * m_Q4;
    m_a2 = m_Q4 * m_Ts * m_Ts * m_wc4 * m_wc4 - 2.0 * m_Ts * m_wc4 + 4.0 * m_Q4;

    m_b0 /= m_a0;
    m_b1 /= m_a0;
    m_b2 /= m_a0;

    m_a1 /= m_a0;
    m_a2 /= m_a0;
    m_a0 = 1.0;

    Reset();
}